

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::GenerateFieldAccessor
               (FieldDescriptor *field,bool is_descriptor,Printer *printer)

{
  long lVar1;
  bool bVar2;
  CppType CVar3;
  Type TVar4;
  Descriptor *pDVar5;
  FieldDescriptor *this;
  FieldDescriptor *this_00;
  char *pcVar6;
  EnumDescriptor *pEVar7;
  int32 value;
  int32 extraout_EDX;
  int32 extraout_EDX_00;
  int32 extraout_EDX_01;
  int32 value_00;
  undefined7 in_register_00000031;
  string *this_01;
  string local_c0;
  uint local_9c;
  string local_98;
  allocator local_72;
  allocator local_71;
  string local_70;
  string local_50;
  
  lVar1 = *(long *)(field + 0x58);
  GenerateFieldDocComment(printer,field,(int)CONCAT71(in_register_00000031,is_descriptor),2);
  if (lVar1 == 0) {
    UnderscoresToCamelCase(&local_c0,*(string **)field,true);
    io::Printer::Print<char[11],std::__cxx11::string,char[5],std::__cxx11::string>
              (printer,"public function get^camel_name^()\n{\n    return $this->^name^;\n}\n\n",
               (char (*) [11])"camel_name",&local_c0,(char (*) [5])0x38d8c6,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)field);
  }
  else {
    UnderscoresToCamelCase(&local_c0,*(string **)field,true);
    IntToString_abi_cxx11_(&local_98,(php *)(ulong)*(uint *)(field + 0x44),value);
    io::Printer::Print<char[11],std::__cxx11::string,char[7],std::__cxx11::string>
              (printer,
               "public function get^camel_name^()\n{\n    return $this->readOneof(^number^);\n}\n\n"
               ,(char (*) [11])"camel_name",&local_c0,(char (*) [7])0x3abb91,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  std::__cxx11::string::~string((string *)&local_c0);
  bVar2 = FieldDescriptor::is_map(field);
  if ((!bVar2) && (*(int *)(field + 0x3c) != 3)) {
    CVar3 = FieldDescriptor::cpp_type(field);
    if (CVar3 == CPPTYPE_MESSAGE) {
      bVar2 = IsWrapperType(field);
      if (bVar2) {
        GenerateWrapperFieldGetterDocComment(printer,field);
        UnderscoresToCamelCase(&local_c0,*(string **)field,true);
        io::Printer::Print<char[11],std::__cxx11::string>
                  (printer,
                   "public function get^camel_name^Unwrapped()\n{\n    $wrapper = $this->get^camel_name^();\n    return is_null($wrapper) ? null : $wrapper->getValue();\n}\n\n"
                   ,(char (*) [11])"camel_name",&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
      }
    }
  }
  local_9c = (uint)is_descriptor;
  GenerateFieldDocComment(printer,field,local_9c,1);
  UnderscoresToCamelCase(&local_c0,*(string **)field,true);
  io::Printer::Print<char[11],std::__cxx11::string>
            (printer,"public function set^camel_name^($var)\n{\n",(char (*) [11])"camel_name",
             &local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  Indent(printer);
  bVar2 = FieldDescriptor::is_map(field);
  if (bVar2) {
    pDVar5 = FieldDescriptor::message_type(field);
    std::__cxx11::string::string((string *)&local_c0,"key",(allocator *)&local_98);
    this = Descriptor::FindFieldByName(pDVar5,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::string((string *)&local_c0,"value",(allocator *)&local_98);
    this_00 = Descriptor::FindFieldByName(pDVar5,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    pcVar6 = FieldDescriptor::type_name(this);
    std::__cxx11::string::string((string *)&local_98,pcVar6,&local_71);
    ToUpper(&local_c0,&local_98);
    pcVar6 = FieldDescriptor::type_name(this_00);
    std::__cxx11::string::string((string *)&local_50,pcVar6,&local_72);
    ToUpper(&local_70,&local_50);
    io::Printer::Print<char[9],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,
               "$arr = GPBUtil::checkMapField($var, \\Google\\Protobuf\\Internal\\GPBType::^key_type^, \\Google\\Protobuf\\Internal\\GPBType::^value_type^"
               ,(char (*) [9])0x3c4fd4,&local_c0,(char (*) [11])0x3c50a8,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_98);
    CVar3 = FieldDescriptor::cpp_type(this_00);
    if (CVar3 == CPPTYPE_MESSAGE) {
      pDVar5 = FieldDescriptor::message_type(this_00);
      FullClassName<google::protobuf::Descriptor>(&local_98,pDVar5,SUB41(local_9c,0));
      std::operator+(&local_c0,&local_98,"::class");
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,", \\^class_name^);\n",(char (*) [11])0x391763,&local_c0);
    }
    else {
      CVar3 = FieldDescriptor::cpp_type(this_00);
      if (CVar3 != CPPTYPE_ENUM) {
LAB_0029fc81:
        io::Printer::Print<>(printer,");\n");
        value_00 = extraout_EDX;
        goto LAB_0029fd34;
      }
      pEVar7 = FieldDescriptor::enum_type(this_00);
      FullClassName<google::protobuf::EnumDescriptor>(&local_98,pEVar7,SUB41(local_9c,0));
      std::operator+(&local_c0,&local_98,"::class");
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,", \\^class_name^);\n",(char (*) [11])0x391763,&local_c0);
    }
LAB_0029fd20:
    std::__cxx11::string::~string((string *)&local_c0);
    this_01 = &local_98;
  }
  else {
    if (*(int *)(field + 0x3c) == 3) {
      pcVar6 = FieldDescriptor::type_name(field);
      std::__cxx11::string::string((string *)&local_98,pcVar6,(allocator *)&local_70);
      ToUpper(&local_c0,&local_98);
      io::Printer::Print<char[5],std::__cxx11::string>
                (printer,
                 "$arr = GPBUtil::checkRepeatedField($var, \\Google\\Protobuf\\Internal\\GPBType::^type^"
                 ,(char (*) [5])0x3e3693,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_98);
      CVar3 = FieldDescriptor::cpp_type(field);
      if (CVar3 == CPPTYPE_MESSAGE) {
        pDVar5 = FieldDescriptor::message_type(field);
        FullClassName<google::protobuf::Descriptor>(&local_98,pDVar5,SUB41(local_9c,0));
        std::operator+(&local_c0,&local_98,"::class");
        io::Printer::Print<char[11],std::__cxx11::string>
                  (printer,", \\^class_name^);\n",(char (*) [11])0x391763,&local_c0);
      }
      else {
        CVar3 = FieldDescriptor::cpp_type(field);
        if (CVar3 != CPPTYPE_ENUM) goto LAB_0029fc81;
        pEVar7 = FieldDescriptor::enum_type(field);
        FullClassName<google::protobuf::EnumDescriptor>(&local_98,pEVar7,SUB41(local_9c,0));
        std::operator+(&local_c0,&local_98,"::class");
        io::Printer::Print<char[11],std::__cxx11::string>
                  (printer,", \\^class_name^);\n",(char (*) [11])0x391763,&local_c0);
      }
      goto LAB_0029fd20;
    }
    CVar3 = FieldDescriptor::cpp_type(field);
    if (CVar3 == CPPTYPE_MESSAGE) {
      pDVar5 = FieldDescriptor::message_type(field);
      LegacyFullClassName<google::protobuf::Descriptor>(&local_c0,pDVar5,SUB41(local_9c,0));
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,"GPBUtil::checkMessage($var, \\^class_name^::class);\n",
                 (char (*) [11])0x391763,&local_c0);
    }
    else {
      CVar3 = FieldDescriptor::cpp_type(field);
      if (CVar3 != CPPTYPE_ENUM) {
        CVar3 = FieldDescriptor::cpp_type(field);
        if (CVar3 == CPPTYPE_STRING) {
          TVar4 = FieldDescriptor::type(field);
          local_c0._M_dataplus._M_p = "False";
          if (TVar4 == TYPE_STRING) {
            local_c0._M_dataplus._M_p = "True";
          }
          io::Printer::Print<char[5],char_const*>
                    (printer,"GPBUtil::checkString($var, ^utf8^);\n",(char (*) [5])0x3dd319,
                     (char **)&local_c0);
          value_00 = extraout_EDX_00;
          goto LAB_0029fd34;
        }
        pcVar6 = FieldDescriptor::cpp_type_name(field);
        std::__cxx11::string::string((string *)&local_98,pcVar6,(allocator *)&local_70);
        UnderscoresToCamelCase(&local_c0,&local_98,true);
        io::Printer::Print<char[5],std::__cxx11::string>
                  (printer,"GPBUtil::check^type^($var);\n",(char (*) [5])0x3e3693,&local_c0);
        goto LAB_0029fd20;
      }
      pEVar7 = FieldDescriptor::enum_type(field);
      LegacyFullClassName<google::protobuf::EnumDescriptor>(&local_c0,pEVar7,SUB41(local_9c,0));
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,"GPBUtil::checkEnum($var, \\^class_name^::class);\n",
                 (char (*) [11])0x391763,&local_c0);
    }
    this_01 = &local_c0;
  }
  std::__cxx11::string::~string((string *)this_01);
  value_00 = extraout_EDX_01;
LAB_0029fd34:
  if (lVar1 == 0) {
    if (*(int *)(field + 0x3c) == 3) {
      pcVar6 = "$this->^name^ = $arr;\n";
    }
    else {
      pcVar6 = "$this->^name^ = $var;\n";
    }
    io::Printer::Print<char[5],std::__cxx11::string>
              (printer,pcVar6,(char (*) [5])0x38d8c6,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)field);
  }
  else {
    IntToString_abi_cxx11_(&local_c0,(php *)(ulong)*(uint *)(field + 0x44),value_00);
    io::Printer::Print<char[7],std::__cxx11::string>
              (printer,"$this->writeOneof(^number^, $var);\n",(char (*) [7])0x3abb91,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  if (is_descriptor) {
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,"$this->has_^field_name^ = true;\n",(char (*) [11])0x3aba68,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)field);
  }
  io::Printer::Print<>(printer,"\nreturn $this;\n");
  Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  bVar2 = FieldDescriptor::is_map(field);
  if ((!bVar2) && (*(int *)(field + 0x3c) != 3)) {
    CVar3 = FieldDescriptor::cpp_type(field);
    if (CVar3 == CPPTYPE_MESSAGE) {
      bVar2 = IsWrapperType(field);
      if (bVar2) {
        GenerateWrapperFieldSetterDocComment(printer,field);
        UnderscoresToCamelCase(&local_c0,*(string **)field,true);
        pDVar5 = FieldDescriptor::message_type(field);
        LegacyFullClassName<google::protobuf::Descriptor>(&local_98,pDVar5,SUB41(local_9c,0));
        io::Printer::Print<char[11],std::__cxx11::string,char[13],std::__cxx11::string>
                  (printer,
                   "public function set^camel_name^Unwrapped($var)\n{\n    $wrappedVar = is_null($var) ? null : new \\^wrapper_type^([\'value\' => $var]);\n    return $this->set^camel_name^($wrappedVar);\n}\n\n"
                   ,(char (*) [11])"camel_name",&local_c0,(char (*) [13])"wrapper_type",&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_c0);
      }
    }
  }
  if (is_descriptor) {
    UnderscoresToCamelCase(&local_c0,*(string **)field,true);
    io::Printer::Print<char[11],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,
               "public function has^camel_name^()\n{\n    return $this->has_^field_name^;\n}\n\n",
               (char (*) [11])"camel_name",&local_c0,(char (*) [11])0x3aba68,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)field);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  return;
}

Assistant:

void GenerateFieldAccessor(const FieldDescriptor* field, bool is_descriptor,
                           io::Printer* printer) {
  const OneofDescriptor* oneof = field->containing_oneof();

  // Generate getter.
  if (oneof != NULL) {
    GenerateFieldDocComment(printer, field, is_descriptor, kFieldGetter);
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    return $this->readOneof(^number^);\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true),
        "number", IntToString(field->number()));
  } else {
    GenerateFieldDocComment(printer, field, is_descriptor, kFieldGetter);
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    return $this->^name^;\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "name",
        field->name());
  }

  // For wrapper types, generate an additional getXXXUnwrapped getter
  if (!field->is_map() &&
      !field->is_repeated() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      IsWrapperType(field)) {
    GenerateWrapperFieldGetterDocComment(printer, field);
    printer->Print(
        "public function get^camel_name^Unwrapped()\n"
        "{\n"
        "    $wrapper = $this->get^camel_name^();\n"
        "    return is_null($wrapper) ? null : $wrapper->getValue();\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true));
  }

  // Generate setter.
  GenerateFieldDocComment(printer, field, is_descriptor, kFieldSetter);
  printer->Print(
      "public function set^camel_name^($var)\n"
      "{\n",
      "camel_name", UnderscoresToCamelCase(field->name(), true));

  Indent(printer);

  // Type check.
  if (field->is_map()) {
    const Descriptor* map_entry = field->message_type();
    const FieldDescriptor* key = map_entry->FindFieldByName("key");
    const FieldDescriptor* value = map_entry->FindFieldByName("value");
    printer->Print(
        "$arr = GPBUtil::checkMapField($var, "
        "\\Google\\Protobuf\\Internal\\GPBType::^key_type^, "
        "\\Google\\Protobuf\\Internal\\GPBType::^value_type^",
        "key_type", ToUpper(key->type_name()),
        "value_type", ToUpper(value->type_name()));
    if (value->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(value->message_type(), is_descriptor) + "::class");
    } else if (value->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(value->enum_type(), is_descriptor) + "::class");
    } else {
      printer->Print(");\n");
    }
  } else if (field->is_repeated()) {
    printer->Print(
        "$arr = GPBUtil::checkRepeatedField($var, "
        "\\Google\\Protobuf\\Internal\\GPBType::^type^",
        "type", ToUpper(field->type_name()));
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(field->message_type(), is_descriptor) + "::class");
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(field->enum_type(), is_descriptor) + "::class");
    } else {
      printer->Print(");\n");
    }
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    printer->Print(
        "GPBUtil::checkMessage($var, \\^class_name^::class);\n",
        "class_name", LegacyFullClassName(field->message_type(), is_descriptor));
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
    printer->Print(
        "GPBUtil::checkEnum($var, \\^class_name^::class);\n",
        "class_name", LegacyFullClassName(field->enum_type(), is_descriptor));
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    printer->Print(
        "GPBUtil::checkString($var, ^utf8^);\n",
        "utf8",
        field->type() == FieldDescriptor::TYPE_STRING ? "True": "False");
  } else {
    printer->Print(
        "GPBUtil::check^type^($var);\n",
        "type", UnderscoresToCamelCase(field->cpp_type_name(), true));
  }

  if (oneof != NULL) {
    printer->Print(
        "$this->writeOneof(^number^, $var);\n",
        "number", IntToString(field->number()));
  } else if (field->is_repeated()) {
    printer->Print(
        "$this->^name^ = $arr;\n",
        "name", field->name());
  } else {
    printer->Print(
        "$this->^name^ = $var;\n",
        "name", field->name());
  }

  // Set has bit for proto2 only.
  if (is_descriptor) {
    printer->Print(
        "$this->has_^field_name^ = true;\n",
        "field_name", field->name());
  }

  printer->Print("\nreturn $this;\n");

  Outdent(printer);

  printer->Print(
      "}\n\n");

  // For wrapper types, generate an additional setXXXValue getter
  if (!field->is_map() &&
      !field->is_repeated() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      IsWrapperType(field)) {
    GenerateWrapperFieldSetterDocComment(printer, field);
    printer->Print(
        "public function set^camel_name^Unwrapped($var)\n"
        "{\n"
        "    $wrappedVar = is_null($var) ? null : new \\^wrapper_type^(['value' => $var]);\n"
        "    return $this->set^camel_name^($wrappedVar);\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true),
        "wrapper_type", LegacyFullClassName(field->message_type(), is_descriptor));
  }

  // Generate has method for proto2 only.
  if (is_descriptor) {
    printer->Print(
        "public function has^camel_name^()\n"
        "{\n"
        "    return $this->has_^field_name^;\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true),
        "field_name", field->name());
  }
}